

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  pointer ppTVar1;
  Index IVar2;
  FuncType *pFVar3;
  
  IVar2 = BindingHash::FindIndex(&this->type_bindings,var);
  ppTVar1 = (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->types).
                    super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    pFVar3 = (FuncType *)ppTVar1[IVar2];
    if ((pFVar3->super_TypeEntry).kind_ != Func) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::FuncType, Base = wabt::TypeEntry]"
                   );
    }
  }
  else {
    pFVar3 = (FuncType *)0x0;
  }
  return pFVar3;
}

Assistant:

FuncType* Module::GetFuncType(const Var& var) {
  Index index = type_bindings.FindIndex(var);
  if (index >= types.size()) {
    return nullptr;
  }
  return cast<FuncType>(types[index]);
}